

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

void QMutableTouchEvent::addPoint(QTouchEvent *e,QEventPoint *point)

{
  QList<QEventPoint> *this;
  State SVar1;
  iterator iVar2;
  QPointingDevice *pQVar3;
  
  this = &(e->super_QPointerEvent).m_points;
  QList<QEventPoint>::emplaceBack<QEventPoint_const&>(this,point);
  iVar2 = QList<QEventPoint>::end(this);
  pQVar3 = QEventPoint::device(iVar2.i + -1);
  if (pQVar3 == (QPointingDevice *)0x0) {
    (iVar2.i[-1].d.d.ptr)->device =
         (QPointingDevice *)(e->super_QPointerEvent).super_QInputEvent.m_dev;
  }
  SVar1 = QEventPoint::state(point);
  (e->m_touchPointStates).super_QFlagsStorageHelper<QEventPoint::State,_4>.
  super_QFlagsStorage<QEventPoint::State>.i =
       (e->m_touchPointStates).super_QFlagsStorageHelper<QEventPoint::State,_4>.
       super_QFlagsStorage<QEventPoint::State>.i | (uint)SVar1;
  return;
}

Assistant:

void QMutableTouchEvent::addPoint(QTouchEvent *e, const QEventPoint &point)
{
    e->m_points.append(point);
    auto &added = e->m_points.last();
    if (!added.device())
        QMutableEventPoint::setDevice(added, e->pointingDevice());
    e->m_touchPointStates |= point.state();
}